

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality.cpp
# Opt level: O2

ScalarFunction * duckdb::CardinalityFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff5c;
  FunctionNullHandling in_stack_ffffffffffffff68;
  allocator_type local_91;
  bind_lambda_function_t in_stack_ffffffffffffff70;
  code *local_78 [2];
  code *local_68;
  code *local_60;
  LogicalType local_58;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_40;
  LogicalType local_28;
  
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffff70,ANY);
  __l._M_len = 1;
  __l._M_array = (iterator)&stack0xffffffffffffff70;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_40,__l,&local_91);
  LogicalType::LogicalType(&local_58,UBIGINT);
  local_78[1] = (code *)0x0;
  local_78[0] = CardinalityFunction;
  local_60 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_68 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  LogicalType::LogicalType(&local_28,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_28;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff54;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff5c;
  ScalarFunction::ScalarFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_40,&local_58,
             (scalar_function_t *)local_78,CardinalityBind,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_ffffffffffffff68,in_stack_ffffffffffffff70);
  LogicalType::~LogicalType(&local_28);
  ::std::_Function_base::~_Function_base((_Function_base *)local_78);
  LogicalType::~LogicalType(&local_58);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_40);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffff70);
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffff70,ANY);
  LogicalType::operator=
            (&(in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs,
             (LogicalType *)&stack0xffffffffffffff70);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffff70);
  (in_RDI->super_BaseScalarFunction).null_handling = DEFAULT_NULL_HANDLING;
  return in_RDI;
}

Assistant:

ScalarFunction CardinalityFun::GetFunction() {
	ScalarFunction fun({LogicalType::ANY}, LogicalType::UBIGINT, CardinalityFunction, CardinalityBind);
	fun.varargs = LogicalType::ANY;
	fun.null_handling = FunctionNullHandling::DEFAULT_NULL_HANDLING;
	return fun;
}